

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool AddModuleFunction(Allocator *allocator,char *module,_func_void *ptrRaw,void *funcWrap,
                      _func_void_void_ptr_char_ptr_char_ptr *ptrWrap,char *name,int index,
                      char **errorPos,char *errorBuf,uint errorBufSize,int optimizationLevel)

{
  ArrayView<InplaceStr> activeImports;
  ByteCode *pBVar1;
  char *allocator_00;
  uint uVar2;
  uint local_90;
  uint i;
  uint end;
  ExternFuncInfo *fInfo;
  ByteCode *code;
  undefined1 auStack_70 [4];
  uint hash;
  uint local_68;
  undefined4 uStack_64;
  InplaceStr local_60;
  ByteCode *local_50;
  char *bytecode;
  char *name_local;
  _func_void_void_ptr_char_ptr_char_ptr *ptrWrap_local;
  void *funcWrap_local;
  _func_void *ptrRaw_local;
  char *module_local;
  Allocator *allocator_local;
  
  bytecode = name;
  name_local = (char *)ptrWrap;
  ptrWrap_local = (_func_void_void_ptr_char_ptr_char_ptr *)funcWrap;
  funcWrap_local = ptrRaw;
  ptrRaw_local = (_func_void *)module;
  module_local = (char *)allocator;
  local_50 = (ByteCode *)BinaryCache::FindBytecode(module,true);
  allocator_00 = module_local;
  if (local_50 == (ByteCode *)0x0) {
    InplaceStr::InplaceStr(&local_60,(char *)ptrRaw_local);
    ArrayView<InplaceStr>::ArrayView((ArrayView<InplaceStr> *)auStack_70);
    activeImports.count = local_68;
    activeImports._12_4_ = uStack_64;
    activeImports.data = _auStack_70;
    local_50 = (ByteCode *)
               BuildModuleFromPath((Allocator *)allocator_00,local_60,(char *)0x0,true,errorPos,
                                   errorBuf,errorBufSize,optimizationLevel,activeImports,
                                   (CompilerStatistics *)0x0);
  }
  if (local_50 == (ByteCode *)0x0) {
    allocator_local._7_1_ = false;
  }
  else {
    uVar2 = NULLC::GetStringHash(bytecode);
    pBVar1 = local_50;
    _i = FindFirstFunc(local_50);
    for (local_90 = 0; local_90 < pBVar1->functionCount - pBVar1->moduleFunctionCount;
        local_90 = local_90 + 1) {
      if (uVar2 == _i->nameHash) {
        if (index == 0) {
          _i->regVmAddress = -1;
          _i->funcPtrRaw = (_func_void *)funcWrap_local;
          _i->funcPtrWrapTarget = ptrWrap_local;
          _i->funcPtrWrap = (_func_void_void_ptr_char_ptr_char_ptr *)name_local;
          index = -1;
          break;
        }
        index = index + -1;
      }
      _i = _i + 1;
    }
    if (index == -1) {
      allocator_local._7_1_ = true;
    }
    else {
      *errorPos = (char *)0x0;
      NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,
                         "ERROR: function \'%s\' or one of it\'s overload is not found in module \'%s\'"
                         ,bytecode,ptrRaw_local);
      allocator_local._7_1_ = false;
    }
  }
  return allocator_local._7_1_;
}

Assistant:

bool AddModuleFunction(Allocator *allocator, const char* module, void (*ptrRaw)(), void *funcWrap, void (*ptrWrap)(void *func, char* retBuf, char* argBuf), const char* name, int index, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel)
{
	const char *bytecode = BinaryCache::FindBytecode(module, true);

	// Create module if not found
	if(!bytecode)
		bytecode = BuildModuleFromPath(allocator, InplaceStr(module), NULL, true, errorPos, errorBuf, errorBufSize, optimizationLevel, ArrayView<InplaceStr>(), NULL);

	if(!bytecode)
		return false;

	unsigned hash = NULLC::GetStringHash(name);
	ByteCode *code = (ByteCode*)bytecode;

	// Find function and set pointer
	ExternFuncInfo *fInfo = FindFirstFunc(code);

	unsigned end = code->functionCount - code->moduleFunctionCount;
	for(unsigned i = 0; i < end; i++)
	{
		if(hash == fInfo->nameHash)
		{
			if(index == 0)
			{
				fInfo->regVmAddress = -1;

				fInfo->funcPtrRaw = ptrRaw;
				fInfo->funcPtrWrapTarget = funcWrap;
				fInfo->funcPtrWrap = ptrWrap;

				index--;
				break;
			}

			index--;
		}

		fInfo++;
	}

	if(index != -1)
	{
		*errorPos = NULL;

		NULLC::SafeSprintf(errorBuf, errorBufSize, "ERROR: function '%s' or one of it's overload is not found in module '%s'", name, module);

		return false;
	}

	return true;
}